

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-spoil.c
# Opt level: O3

errr init_spoil(int argc,char **argv)

{
  int iVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  _Bool _Var5;
  _Bool _Var6;
  int iVar7;
  uint uVar8;
  char *pcVar9;
  ang_file *paVar10;
  ang_file *f;
  int *piVar11;
  ulong uVar12;
  int iVar13;
  uint32_t uVar14;
  ulong uVar15;
  long lVar16;
  char *pcVar17;
  bool bVar18;
  char defname [1024];
  char *valend;
  uint32_t local_85c;
  char *local_840;
  char local_838 [1024];
  char *local_438 [129];
  
  if (argc < 2) {
    init_angband();
LAB_00125fc3:
    _Var5 = player_make_simple((char *)0x0,(char *)0x0,"Spoiler");
    if (_Var5) {
LAB_0012629e:
      flavor_set_all_aware();
      lVar16 = 0;
      do {
        if ((&opts[0].enabled)[lVar16] == true) {
          (**(code **)((long)&opts[0].func + lVar16))();
        }
        lVar16 = lVar16 + 0x20;
      } while (lVar16 != 0x80);
      cleanup_angband();
      exit(0);
    }
LAB_00125fdb:
    pcVar17 = "init-spoil: could not initialize player.";
  }
  else {
    iVar1 = argc + -1;
    uVar15 = 1;
    bVar18 = false;
    local_85c = 0;
    bVar4 = false;
    pcVar17 = (char *)0x0;
    bVar3 = false;
    do {
      pcVar9 = argv[uVar15];
      iVar13 = (int)uVar15;
      if (*pcVar9 == '-') {
        cVar2 = pcVar9[1];
        if (cVar2 == 's') {
          if (pcVar9[2] != '\0') goto LAB_00125ea6;
          if (iVar13 < iVar1) {
            uVar12 = strtoul(argv[uVar15 + 1],local_438,0x10);
            if (((*argv[uVar15 + 1] == '\0') || (_Var5 = contains_only_spaces(local_438[0]), !_Var5)
                ) || (uVar12 >> 0x20 != 0)) {
              if (uVar12 >> 0x20 == 0) {
                printf("init-spoil: \'%s\' requires an integer argument, the randart seed\n");
              }
              else {
                puts("init-spoil: seed is too large");
              }
              bVar18 = true;
            }
            else {
              bVar3 = true;
              bVar4 = true;
              local_85c = (uint32_t)uVar12;
            }
            goto LAB_00125fb4;
          }
          pcVar9 = "init-spoil: \'%s\' requires an argument, the randart seed\n";
          goto LAB_00125ec8;
        }
        if (cVar2 == 'r') {
          if (pcVar9[2] != '\0') {
LAB_00125ea6:
            lVar16 = 0;
            do {
              if ((cVar2 == (&opts[0].letter)[lVar16]) && (pcVar9[2] == '\0')) {
                if (iVar13 < iVar1) {
                  (&opts[0].enabled)[lVar16] = true;
                  *(char **)((long)&opts[0].path + lVar16) = argv[uVar15 + 1];
                  goto LAB_00125fb4;
                }
                pcVar9 = "init-spoil: \'%s\' requires an argument, the name of the spoiler file\n";
                goto LAB_00125ec8;
              }
              lVar16 = lVar16 + 0x20;
            } while (lVar16 != 0x80);
            goto LAB_00125ec1;
          }
          if (iVar1 <= iVar13) {
            pcVar9 = "init-spoil: \'%s\' requires an argument, the name of a randart file\n";
            goto LAB_00125ec8;
          }
          pcVar17 = argv[uVar15 + 1];
          bVar3 = true;
LAB_00125fb4:
          iVar7 = 2;
        }
        else {
          if ((cVar2 != 'p') || (pcVar9[2] != '\0')) goto LAB_00125ea6;
          bVar3 = true;
          iVar7 = 1;
          pcVar17 = (char *)0x0;
        }
      }
      else {
LAB_00125ec1:
        pcVar9 = "init-spoil: bad argument \'%s\'\n";
LAB_00125ec8:
        printf(pcVar9);
        iVar7 = 1;
        bVar18 = true;
      }
      uVar15 = (ulong)(uint)(iVar13 + iVar7);
    } while (iVar13 + iVar7 < argc);
    if (bVar18) {
      return 1;
    }
    init_angband();
    if (!bVar3) goto LAB_00125fc3;
    if (pcVar17 != (char *)0x0 || bVar4) {
      _Var5 = player_make_simple((char *)0x0,(char *)0x0,"Spoiler");
      if (_Var5) {
        memset(local_838,0,0x400);
        deactivate_randart_file();
        pcVar9 = option_name(0x1e);
        option_set(pcVar9,1);
        if (pcVar17 == (char *)0x0) {
          seed_randart = local_85c;
          do_randart(local_85c,true);
          uVar14 = seed_randart;
LAB_00126270:
          seed_randart = uVar14;
          cleanup_parser(&artifact_parser);
          run_parser(&randart_parser);
          if (pcVar17 == (char *)0x0) {
            deactivate_randart_file();
          }
          else {
            file_delete(local_838);
          }
          goto LAB_0012629e;
        }
        path_build(local_838,0x400,ANGBAND_DIR_USER,"randart.txt");
        paVar10 = file_open(pcVar17,MODE_READ,0xffffffff);
        if (paVar10 != (ang_file *)0x0) {
          f = file_open(local_838,MODE_WRITE,FTYPE_TEXT);
          if (f == (ang_file *)0x0) {
            file_close(paVar10);
          }
          else {
            do {
              uVar8 = file_read(paVar10,(char *)local_438,0x400);
              bVar18 = uVar8 == 0;
              if ((int)uVar8 < 1) goto LAB_0012617c;
              _Var5 = file_write(f,(char *)local_438,(ulong)uVar8);
            } while (_Var5);
            bVar18 = false;
LAB_0012617c:
            _Var5 = file_close(f);
            _Var6 = file_close(paVar10);
            if (((bVar18) && (_Var6)) && (_Var5)) {
              paVar10 = file_open(pcVar17,MODE_READ,0xffffffff);
              uVar14 = 0;
              if (paVar10 != (ang_file *)0x0) {
                _Var5 = file_getl(paVar10,(char *)local_438,0x100);
                uVar14 = 0;
                if ((_Var5) &&
                   (pcVar9 = my_stristr((char *)local_438,"seed "), pcVar9 != (char *)0x0)) {
                  piVar11 = __errno_location();
                  *piVar11 = 0;
                  uVar12 = strtoul(pcVar9 + 5,&local_840,0x10);
                  uVar15 = 0;
                  if (uVar12 < 0x100000000) {
                    uVar15 = uVar12;
                  }
                  uVar14 = (uint32_t)uVar15;
                  if (local_840 == pcVar9 + 5) {
                    uVar14 = 0;
                  }
                }
                file_close(paVar10);
              }
              goto LAB_00126270;
            }
          }
        }
        pcVar17 = "init-spoil: could not copy randart file to \'%s\'.\n";
        pcVar9 = local_838;
LAB_001261a7:
        printf(pcVar17,pcVar9);
        goto LAB_00125fe7;
      }
      goto LAB_00125fdb;
    }
    safe_setuid_grab();
    _Var5 = file_exists(savefile);
    safe_setuid_drop();
    if (_Var5) {
      _Var5 = savefile_load(savefile,false);
      deactivate_randart_file();
      if (_Var5) goto LAB_0012629e;
      pcVar17 = 
      "init-spoil: using artifacts associated with a savefile, but the savefile set by main, \'%s\', failed to load.\n"
      ;
LAB_00126157:
      pcVar9 = savefile;
      goto LAB_001261a7;
    }
    if (savefile[0] != '\0') {
      pcVar17 = 
      "init-spoil: using artifacts associated with a savefile, but the savefile set by main, \'%s\', does not exist.\n"
      ;
      goto LAB_00126157;
    }
    pcVar17 = 
    "init-spoil: using artifacts associated with a savefile, but main did not set the savefile.";
  }
  puts(pcVar17);
LAB_00125fe7:
  cleanup_angband();
  return 1;
}

Assistant:

errr init_spoil(int argc, char *argv[]) {
	/* Skip over argv[0] */
	int i = 1;
	int result = 0;
	bool load_randart = false;
	const char *randart_name = NULL;
	bool have_specified_seed = false;
	uint32_t specified_seed = 0;

	/* Parse the arguments. */
	while (1) {
		bool badarg = false;
		int increment = 1;

		if (i >= argc) {
			break;
		}

		if (argv[i][0] == '-') {
			/* Try to match with a known option. */
			if (argv[i][1] == 'p' && argv[i][2] == '\0') {
				load_randart = true;
				randart_name = NULL;
			} else if (argv[i][1] == 'r' && argv[i][2] == '\0') {
				if (i < argc - 1) {
					load_randart = true;
					/* Record the name; don't parse it. */
					randart_name = argv[i + 1];
					++increment;
				} else {
					printf("init-spoil: '%s' requires an argument, the name of a randart file\n", argv[i]);
					result = 1;
				}
			} else if (argv[i][1] == 's' && argv[i][2] == '\0') {
				if (i < argc - 1) {
					char *valend;
					unsigned long val;

					val = strtoul(argv[i + 1], &valend, 16);
					++increment;
					if (argv[i + 1][0] != '\0'
							&& contains_only_spaces(valend)
							&& val <= 0xFFFFFFFFul) {
						load_randart = true;
						have_specified_seed = true;
						specified_seed = val;
					} else if (val > 0xFFFFFFFFul) {
						printf("init-spoil: seed is too large\n");
						result = 1;
					} else {
						printf("init-spoil: '%s' requires an integer argument, the randart seed\n",
							argv[i]);
						result = 1;
					}
				} else {
					printf("init-spoil: '%s' requires an argument, the randart seed\n", argv[i]);
					result = 1;
				}
			} else {
				int j = 0;

				while (1) {
					if (j >= (int)N_ELEMENTS(opts)) {
						badarg = true;
						break;
					}

					if (argv[i][1] == opts[j].letter &&
							argv[i][2] == '\0') {
						if (i < argc - 1) {
							opts[j].enabled = true;
							/*
							 * Record the filename
							 * and skip parsing
							 * of it.
							 */
							opts[j].path =
								argv[i + 1];
							++increment;
						} else {
							printf("init-spoil: '%s' requires an argument, the name of the spoiler file\n", argv[i]);
							result = 1;
						}
						break;
					}

					++j;
				}
			}
		} else {
			badarg = true;
		}

		if (badarg) {
			printf("init-spoil: bad argument '%s'\n", argv[i]);
			result = 1;
		}

		i += increment;
	}

	if (result != 0) return result;

	/* Generate the spoilers. */
	init_angband();

	if (load_randart) {
		if (randart_name || have_specified_seed) {
			if (player_make_simple(NULL, NULL, "Spoiler")) {
				char defname[1024] = "";

				deactivate_randart_file();
				option_set(option_name(OPT_birth_randarts),
					true);

				if (randart_name) {
					path_build(defname, sizeof(defname),
						ANGBAND_DIR_USER,
						"randart.txt");
					/*
					 * Copy rather than move in case the
					 * file supplied is read-only.
					 */
					if (copy_file(randart_name, defname,
							FTYPE_TEXT)) {
						seed_randart = parse_seed(randart_name);
					} else {
						printf("init-spoil: could not copy randart file to '%s'.\n", defname);
						result = 1;
					}
				} else {
					seed_randart = specified_seed;
					do_randart(seed_randart, true);
				}

				if (result == 0) {
					cleanup_parser(&artifact_parser);
					run_parser(&randart_parser);
					if (randart_name) {
						file_delete(defname);
					} else {
						deactivate_randart_file();
					}
				}
			} else {
				printf("init-spoil: could not initialize player.\n");
				result = 1;
			}
		} else {
			bool exists;

			safe_setuid_grab();
			exists = file_exists(savefile);
			safe_setuid_drop();
			if (exists) {
				bool loaded_save =
					savefile_load(savefile, false);

				deactivate_randart_file();
				if (!loaded_save) {
					printf("init-spoil: using artifacts "
						"associated with a savefile, "
						"but the savefile set by "
						"main, '%s', failed to load.\n",
						savefile);
					result = 1;
				}
			} else if (savefile[0]) {
				printf("init-spoil: using artifacts associated "
					"with a savefile, but the savefile set "
					"by main, '%s', does not exist.\n",
					savefile);
				result = 1;
			} else {
				printf("init-spoil: using artifacts associated "
					"with a savefile, but main did not set "
					"the savefile.\n");
				result = 1;
			}
		}
	} else if (!player_make_simple(NULL, NULL, "Spoiler")) {
		printf("init-spoil: could not initialize player.\n");
		result = 1;
	}

	if (result == 0) {
		flavor_set_all_aware();
		for (i = 0; i < (int)N_ELEMENTS(opts); ++i) {
			if (!opts[i].enabled) continue;
			(*(opts[i].func))(opts[i].path);
		}
	}

	cleanup_angband();

	if (result == 0) {
		exit(0);
	}

	return result;
}